

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

Status __thiscall
soplex::SPxSolverBase<double>::getDualfarkas
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  pointer __s;
  pointer pdVar1;
  Nonzero<double> *pNVar2;
  Status SVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->initialized == false) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"XSOLVE10 No Problem loaded","");
    *puVar5 = &PTR__SPxException_003af870;
    puVar5[1] = puVar5 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar5 + 1),local_40,local_40 + local_38);
    *puVar5 = &PTR__SPxException_003b0700;
    __cxa_throw(puVar5,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  __s = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar1 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar1) {
    memset(__s,0,(long)pdVar1 - (long)__s & 0xfffffffffffffff8);
    memset(__s,0,(long)pdVar1 - (long)__s & 0xfffffffffffffff8);
  }
  lVar4 = (long)(this->dualFarkas).super_SVectorBase<double>.memused;
  if (0 < lVar4) {
    pNVar2 = (this->dualFarkas).super_SVectorBase<double>.m_elem;
    lVar6 = 0;
    do {
      __s[*(int *)((long)&pNVar2->idx + lVar6)] = *(double *)((long)&pNVar2->val + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar4 * 0x10 != lVar6);
  }
  SVar3 = status(this);
  return SVar3;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getDualfarkas(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE10 No Problem loaded");
      // return NOT_INIT;
   }

   assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::INFEASIBLE);
   p_vector.clear();
   p_vector = dualFarkas;

   return status();
}